

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O3

void parse_escapes(char *src,mtree_entry *mentry)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  byte bVar4;
  
  bVar4 = *src;
  pbVar3 = (byte *)src;
  if (bVar4 == 0x2e && mentry != (mtree_entry *)0x0) {
    bVar4 = 0x2e;
    if (src[1] == '\0') {
      mentry->full = '\x01';
      bVar4 = *src;
      goto LAB_0017842b;
    }
  }
  else {
LAB_0017842b:
    if (bVar4 == 0) goto LAB_00178571;
  }
  do {
    pbVar1 = (byte *)src + 1;
    if ((mentry == (mtree_entry *)0x0) || (bVar4 != 0x2f)) {
      if (bVar4 == 0x5c) {
        bVar2 = *pbVar1;
        bVar4 = 0x5c;
        if (bVar2 < 0x62) {
          if (0x5b < bVar2) {
            if (bVar2 != 0x5c) {
              if (bVar2 != 0x61) goto switchD_0017847f_caseD_6f;
              bVar4 = 7;
            }
            goto LAB_0017855b;
          }
          if (2 < bVar2 - 0x31) {
            if (bVar2 != 0x30) goto switchD_0017847f_caseD_6f;
            if ((byte)(((byte *)src)[2] - 0x38) < 0xf8) {
              bVar4 = 0;
              goto LAB_0017855b;
            }
          }
          if (((((byte *)src)[2] & 0xf8) == 0x30) && ((((byte *)src)[3] & 0xf8) == 0x30)) {
            bVar4 = (((byte *)src)[3] + ((((byte *)src)[2] & 7) << 3 | bVar2 << 6)) - 0x30;
            pbVar1 = (byte *)src + 4;
          }
        }
        else {
          switch(bVar2) {
          case 0x6e:
            bVar4 = 10;
            break;
          case 0x6f:
          case 0x70:
          case 0x71:
          case 0x75:
            goto switchD_0017847f_caseD_6f;
          case 0x72:
            bVar4 = 0xd;
            break;
          case 0x73:
            bVar4 = 0x20;
            break;
          case 0x74:
            bVar4 = 9;
            break;
          case 0x76:
            bVar4 = 0xb;
            break;
          default:
            if (bVar2 == 0x62) {
              bVar4 = 8;
            }
            else {
              if (bVar2 != 0x66) goto switchD_0017847f_caseD_6f;
              bVar4 = 0xc;
            }
          }
LAB_0017855b:
          pbVar1 = (byte *)src + 2;
        }
      }
    }
    else {
      mentry->full = '\x01';
      bVar4 = 0x2f;
    }
switchD_0017847f_caseD_6f:
    src = (char *)pbVar1;
    *pbVar3 = bVar4;
    pbVar3 = pbVar3 + 1;
    bVar4 = *src;
  } while (bVar4 != 0);
LAB_00178571:
  *pbVar3 = 0;
  return;
}

Assistant:

static void
parse_escapes(char *src, struct mtree_entry *mentry)
{
	char *dest = src;
	char c;

	if (mentry != NULL && strcmp(src, ".") == 0)
		mentry->full = 1;

	while (*src != '\0') {
		c = *src++;
		if (c == '/' && mentry != NULL)
			mentry->full = 1;
		if (c == '\\') {
			switch (src[0]) {
			case '0':
				if (src[1] < '0' || src[1] > '7') {
					c = 0;
					++src;
					break;
				}
				/* FALLTHROUGH */
			case '1':
			case '2':
			case '3':
				if (src[1] >= '0' && src[1] <= '7' &&
				    src[2] >= '0' && src[2] <= '7') {
					c = (src[0] - '0') << 6;
					c |= (src[1] - '0') << 3;
					c |= (src[2] - '0');
					src += 3;
				}
				break;
			case 'a':
				c = '\a';
				++src;
				break;
			case 'b':
				c = '\b';
				++src;
				break;
			case 'f':
				c = '\f';
				++src;
				break;
			case 'n':
				c = '\n';
				++src;
				break;
			case 'r':
				c = '\r';
				++src;
				break;
			case 's':
				c = ' ';
				++src;
				break;
			case 't':
				c = '\t';
				++src;
				break;
			case 'v':
				c = '\v';
				++src;
				break;
			case '\\':
				c = '\\';
				++src;
				break;
			}
		}
		*dest++ = c;
	}
	*dest = '\0';
}